

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue-149-entry-selection.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_141c1::store_err_handler::error
          (store_err_handler *this,json_pointer *ptr,json *instance,string *message)

{
  ostream *poVar1;
  
  (this->super_basic_error_handler).error_ = true;
  poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR: \'");
  poVar1 = nlohmann::json_abi_v3_11_2::operator<<(poVar1,ptr);
  poVar1 = std::operator<<(poVar1,"\' - \'");
  poVar1 = nlohmann::json_abi_v3_11_2::operator<<(poVar1,instance);
  poVar1 = std::operator<<(poVar1,"\': ");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::operator<<(poVar1,"\n");
  std::
  vector<nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back(&this->failed,ptr);
  return;
}

Assistant:

void error(const nlohmann::json::json_pointer &ptr, const json &instance, const std::string &message) override
	{
		nlohmann::json_schema::basic_error_handler::error(ptr, instance, message);
		std::cerr << "ERROR: '" << ptr << "' - '" << instance << "': " << message << "\n";
		failed.push_back(ptr);
	}